

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall wasm::PrintSExpression::visitImportedFunction(PrintSExpression *this,Function *curr)

{
  ostream *poVar1;
  char *__s;
  size_t sVar2;
  Signature sig;
  HeapType local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  poVar1 = this->o;
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)this->indent);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  this->currFunction = curr;
  (this->lastPrintedLocation).fileIndex = 0;
  (this->lastPrintedLocation).lineNumber = 0;
  (this->lastPrintedLocation).columnNumber = 0;
  local_50._0_1_ = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
  emitImportHeader(this,&curr->super_Importable);
  sig = HeapType::getSignature(&curr->type);
  HeapType::HeapType(&local_58,sig);
  handleSignature(this,local_58,(Name)(curr->super_Importable).super_Named.name.super_IString.str);
  local_50 = (long *)CONCAT71(local_50._1_7_,0x29);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
  poVar1 = this->o;
  __s = this->maybeNewLine;
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,__s,sVar2);
  }
  return;
}

Assistant:

void visitImportedFunction(Function* curr) {
    doIndent(o, indent);
    currFunction = curr;
    lastPrintedLocation = {0, 0, 0};
    o << '(';
    emitImportHeader(curr);
    handleSignature(curr->getSig(), curr->name);
    o << ')';
    o << maybeNewLine;
  }